

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

size_t build_certificate_verify_signdata
                 (uint8_t *data,ptls_key_schedule_t *sched,char *context_string)

{
  size_t sVar1;
  ulong uVar2;
  char *in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t datalen;
  
  memset(in_RDI,0x20,0x40);
  sVar1 = strlen(in_RDX);
  memcpy((void *)((long)in_RDI + 0x40),in_RDX,sVar1 + 1);
  sVar1 = strlen(in_RDX);
  (**(code **)(*(long *)(in_RSI + 0x60) + 8))
            (*(undefined8 *)(in_RSI + 0x60),(long)in_RDI + sVar1 + 0x41,2);
  uVar2 = *(long *)(*(long *)(in_RSI + 0x58) + 8) + sVar1 + 0x41;
  if (uVar2 < 0xe3) {
    return uVar2;
  }
  __assert_fail("datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x544,
                "size_t build_certificate_verify_signdata(uint8_t *, ptls_key_schedule_t *, const char *)"
               );
}

Assistant:

static size_t build_certificate_verify_signdata(uint8_t *data, ptls_key_schedule_t *sched, const char *context_string)
{
    size_t datalen = 0;

    memset(data + datalen, 32, 64);
    datalen += 64;
    memcpy(data + datalen, context_string, strlen(context_string) + 1);
    datalen += strlen(context_string) + 1;
    sched->hashes[0].ctx->final(sched->hashes[0].ctx, data + datalen, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    datalen += sched->hashes[0].algo->digest_size;
    assert(datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE);

    return datalen;
}